

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EmissionSystem::ClearEmitterBeams(EmissionSystem *this)

{
  EmissionSystem *this_local;
  
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::clear
            (&this->m_vEmitterBeams);
  this->m_ui8NumberOfBeams = '\0';
  this->m_ui8SystemDataLength = '\x05';
  return;
}

Assistant:

void EmissionSystem::ClearEmitterBeams()
{
    m_vEmitterBeams.clear();
    m_ui8NumberOfBeams = 0;
    m_ui8SystemDataLength = EMISSION_SYSTEM_SIZE / 4;
}